

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly2_reverse_700(poly2 *out,poly2 *in)

{
  crypto_word_t cVar1;
  ulong local_80;
  size_t i_1;
  size_t i;
  poly2 t;
  poly2 *in_local;
  poly2 *out_local;
  
  t.v[10] = (crypto_word_t)in;
  for (i_1 = 0; i_1 < 0xb; i_1 = i_1 + 1) {
    cVar1 = word_reverse(*(crypto_word_t *)(t.v[10] + i_1 * 8));
    t.v[i_1 - 1] = cVar1;
  }
  for (local_80 = 0; local_80 < 10; local_80 = local_80 + 1) {
    out->v[local_80] = *(ulong *)((long)&t + (10 - local_80) * 8 + -8) >> 4;
    out->v[local_80] = *(long *)((long)&t + (9 - local_80) * 8 + -8) << 0x3c | out->v[local_80];
  }
  out->v[10] = i >> 4;
  return;
}

Assistant:

static void poly2_reverse_700(struct poly2 *out, const struct poly2 *in) {
  struct poly2 t;
  for (size_t i = 0; i < WORDS_PER_POLY; i++) {
    t.v[i] = word_reverse(in->v[i]);
  }

  static const size_t shift = BITS_PER_WORD - ((N - 1) % BITS_PER_WORD);
  for (size_t i = 0; i < WORDS_PER_POLY - 1; i++) {
    out->v[i] = t.v[WORDS_PER_POLY - 1 - i] >> shift;
    out->v[i] |= t.v[WORDS_PER_POLY - 2 - i] << (BITS_PER_WORD - shift);
  }
  out->v[WORDS_PER_POLY - 1] = t.v[0] >> shift;
}